

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scrambler.cxx
# Opt level: O0

void __thiscall xray_re::xr_scrambler::init_sboxes(xr_scrambler *this,int seed,int size_mult)

{
  uint uVar1;
  uint uVar2;
  int local_2c;
  int i_2;
  int b;
  int a;
  int i_1;
  int i;
  int size_mult_local;
  int seed_local;
  xr_scrambler *this_local;
  
  for (a = 0xff; -1 < a; a = a + -1) {
    this->m_enc_sbox[a] = (uint8_t)a;
  }
  i = seed;
  for (b = size_mult << 8; b != 0; b = b + -1) {
    i = i * 0x8088405 + 1;
    uVar1 = i >> 0x18 & 0xff;
    do {
      i = i * 0x8088405 + 1;
      uVar2 = i >> 0x18 & 0xff;
    } while (uVar1 == uVar2);
    std::swap<unsigned_char>(this->m_enc_sbox + (int)uVar1,this->m_enc_sbox + (int)uVar2);
  }
  for (local_2c = 0; local_2c != 0x100; local_2c = local_2c + 1) {
    this->m_dec_sbox[this->m_enc_sbox[local_2c]] = (uint8_t)local_2c;
  }
  return;
}

Assistant:

void xr_scrambler::init_sboxes(int seed, int size_mult)
{
	for (int i = SBOX_SIZE - 1; i >= 0; --i)
		m_enc_sbox[i] = uint8_t(i);
	for (int i = size_mult*SBOX_SIZE, a, b; i != 0; --i) {
		seed = 1 + seed * SEED_MULT;
		a = (seed >> 24) & 0xff;
		do {
			seed = 1 + seed * SEED_MULT;
			b = (seed >> 24) & 0xff;
		} while (a == b);
		std::swap(m_enc_sbox[a], m_enc_sbox[b]);
	}
	for (int i = 0; i != SBOX_SIZE; ++i)
		m_dec_sbox[m_enc_sbox[i]] = uint8_t(i);
}